

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncDef.h
# Opt level: O2

void __thiscall FuncDef::FuncDef(FuncDef *this,string *name,Token *token)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)name);
  AST::ASTNode::ASTNode(&this->super_ASTNode,&sStack_38,token);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR_accept_00145600;
  return;
}

Assistant:

FuncDef(std::string name, Token *token) : ASTNode(std::move(name), token) {}